

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

TypeKind google::protobuf::internal::CppTypeToTypeKind(CppType type)

{
  TypeKind local_9;
  CppType type_local;
  
  switch(type) {
  case CPPTYPE_INT32:
    local_9 = kU32;
    break;
  case CPPTYPE_INT64:
    local_9 = kU64;
    break;
  case CPPTYPE_UINT32:
    local_9 = kU32;
    break;
  case CPPTYPE_UINT64:
    local_9 = kU64;
    break;
  case CPPTYPE_DOUBLE:
    local_9 = kDouble;
    break;
  case CPPTYPE_FLOAT:
    local_9 = kFloat;
    break;
  case CPPTYPE_BOOL:
    local_9 = kBool;
    break;
  case CPPTYPE_ENUM:
    local_9 = kU32;
    break;
  case CPPTYPE_STRING:
    local_9 = kString;
    break;
  case CPPTYPE_MESSAGE:
    local_9 = kMessage;
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
                ,0x85);
  }
  return local_9;
}

Assistant:

static UntypedMapBase::TypeKind CppTypeToTypeKind(
    FieldDescriptor::CppType type) {
  using TK = UntypedMapBase::TypeKind;
  switch (type) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return TK::kBool;
    case FieldDescriptor::CPPTYPE_INT32:
      return TK::kU32;
    case FieldDescriptor::CPPTYPE_UINT32:
      return TK::kU32;
    case FieldDescriptor::CPPTYPE_ENUM:
      return TK::kU32;
    case FieldDescriptor::CPPTYPE_INT64:
      return TK::kU64;
    case FieldDescriptor::CPPTYPE_UINT64:
      return TK::kU64;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return TK::kFloat;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return TK::kDouble;
    case FieldDescriptor::CPPTYPE_STRING:
      return TK::kString;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return TK::kMessage;
    default:
      Unreachable();
  }
}